

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O0

void __thiscall
VectorSUnitTest_range_constructor_Test::VectorSUnitTest_range_constructor_Test
          (VectorSUnitTest_range_constructor_Test *this)

{
  VectorSUnitTest_range_constructor_Test *this_local;
  
  VectorSUnitTest::VectorSUnitTest(&this->super_VectorSUnitTest);
  (this->super_VectorSUnitTest).super_Test._vptr_Test =
       (_func_int **)&PTR__VectorSUnitTest_range_constructor_Test_001d0908;
  return;
}

Assistant:

TEST_F(VectorSUnitTest, range_constructor)
{
    std::vector<std::string> vs_src{"0","1","2","3","4"};

    vector_s<std::string, 10> vs(vs_src.begin(), vs_src.end());
    EXPECT_FALSE(vs.empty());
    EXPECT_EQ(5u, vs.size());
    EXPECT_EQ(std::string("0"), vs[0]);
    EXPECT_EQ(std::string("1"), vs[1]);
    EXPECT_EQ(std::string("2"), vs[2]);
    EXPECT_EQ(std::string("3"), vs[3]);
    EXPECT_EQ(std::string("4"), vs[4]);
}